

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_aggregate_expression.cpp
# Opt level: O3

void __thiscall
duckdb::BoundAggregateExpression::BoundAggregateExpression
          (BoundAggregateExpression *this,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *children,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *filter,
          unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
          *bind_info,AggregateType aggr_type)

{
  LogicalType *other;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer puVar3;
  FunctionNullHandling FVar4;
  FunctionErrors FVar5;
  FunctionCollationHandling FVar6;
  AggregateDistinctDependent AVar7;
  long lVar8;
  aggregate_size_t *pp_Var9;
  aggregate_size_t *pp_Var10;
  byte bVar11;
  LogicalType local_48;
  
  bVar11 = 0;
  other = &(function->super_BaseScalarFunction).return_type;
  LogicalType::LogicalType(&local_48,other);
  Expression::Expression(&this->super_Expression,BOUND_AGGREGATE,BOUND_AGGREGATE,&local_48);
  LogicalType::~LogicalType(&local_48);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__BoundAggregateExpression_0197be58;
  SimpleFunction::SimpleFunction((SimpleFunction *)&this->function,(SimpleFunction *)function);
  (this->function).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01963d30;
  LogicalType::LogicalType(&(this->function).super_BaseScalarFunction.return_type,other);
  FVar4 = (function->super_BaseScalarFunction).null_handling;
  FVar5 = (function->super_BaseScalarFunction).errors;
  FVar6 = (function->super_BaseScalarFunction).collation_handling;
  (this->function).super_BaseScalarFunction.stability =
       (function->super_BaseScalarFunction).stability;
  (this->function).super_BaseScalarFunction.null_handling = FVar4;
  (this->function).super_BaseScalarFunction.errors = FVar5;
  (this->function).super_BaseScalarFunction.collation_handling = FVar6;
  (this->function).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_01966bf8;
  pp_Var9 = &function->state_size;
  pp_Var10 = &(this->function).state_size;
  for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pp_Var10 = *pp_Var9;
    pp_Var9 = pp_Var9 + (ulong)bVar11 * -2 + 1;
    pp_Var10 = pp_Var10 + (ulong)bVar11 * -2 + 1;
  }
  AVar7 = function->distinct_dependent;
  (this->function).order_dependent = function->order_dependent;
  (this->function).distinct_dependent = AVar7;
  (this->function).function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (function->function_info).internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (function->function_info).internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (function->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->function).function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->function).function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (function->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  puVar3 = (children->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->children).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (children->
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->children).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  (this->children).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (children->
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (children->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (children->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (children->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bind_info).
  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (bind_info->
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  (bind_info->super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>).
  _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)0x0;
  this->aggr_type = aggr_type;
  (this->filter).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
  .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (filter->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (filter->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  (this->order_bys).
  super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
  .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
       (BoundOrderModifier *)0x0;
  return;
}

Assistant:

BoundAggregateExpression::BoundAggregateExpression(AggregateFunction function, vector<unique_ptr<Expression>> children,
                                                   unique_ptr<Expression> filter, unique_ptr<FunctionData> bind_info,
                                                   AggregateType aggr_type)
    : Expression(ExpressionType::BOUND_AGGREGATE, ExpressionClass::BOUND_AGGREGATE, function.return_type),
      function(std::move(function)), children(std::move(children)), bind_info(std::move(bind_info)),
      aggr_type(aggr_type), filter(std::move(filter)) {
	D_ASSERT(!this->function.name.empty());
}